

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_3_3::OutputFile::initialize(OutputFile *this,Header *header)

{
  bool bVar1;
  Format FVar2;
  int iVar3;
  Box2i *maxScanLineSize;
  LineOrder *pLVar4;
  Header *hdr;
  Compressor *pCVar5;
  reference ppLVar6;
  size_type sVar7;
  undefined8 in_RSI;
  Header *in_RDI;
  int lineOffsetSize;
  size_t i_1;
  LineBuffer *lineBuffer;
  size_t i;
  size_t maxBytesPerLine;
  Box2i *dataWindow;
  string *in_stack_00000108;
  Header *in_stack_00000110;
  Compressor *in_stack_ffffffffffffff80;
  value_type in_stack_ffffffffffffff88;
  Array<char> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd8;
  Compressor *comp;
  Compressor *__n;
  Header *in_stack_ffffffffffffffe0;
  
  Header::operator=((Header *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
  bVar1 = Header::hasType((Header *)0x31615d);
  if (bVar1) {
    Header::setType(in_stack_00000110,in_stack_00000108);
  }
  maxScanLineSize = Header::dataWindow((Header *)0x316182);
  pLVar4 = Header::lineOrder((Header *)0x316191);
  if (*pLVar4 == INCREASING_Y) {
    iVar8 = (maxScanLineSize->min).y;
  }
  else {
    iVar8 = (maxScanLineSize->max).y;
  }
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x78) = iVar8;
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x7c) =
       ((maxScanLineSize->max).y - (maxScanLineSize->min).y) + 1;
  pLVar4 = Header::lineOrder((Header *)0x3161e4);
  *(LineOrder *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x80) =
       *pLVar4;
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x84) =
       (maxScanLineSize->min).x;
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x88) =
       (maxScanLineSize->max).x;
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x8c) =
       (maxScanLineSize->min).y;
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x90) =
       (maxScanLineSize->max).y;
  hdr = (Header *)bytesPerLineTable(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  comp = (Compressor *)0x0;
  while (__n = comp,
        pCVar5 = (Compressor *)
                 std::
                 vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
                 ::size((vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
                         *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header +
                           0x108)), comp < pCVar5) {
    in_stack_ffffffffffffff88 = (value_type)operator_new(0x90);
    in_stack_ffffffffffffff90 = (Array<char> *)Header::compression((Header *)0x3162b1);
    in_stack_ffffffffffffff80 =
         newCompressor((Compression)((ulong)in_RSI >> 0x20),(size_t)maxScanLineSize,hdr);
    anon_unknown_6::LineBuffer::LineBuffer
              ((LineBuffer *)CONCAT44(iVar8,in_stack_ffffffffffffffa0),comp);
    ppLVar6 = std::
              vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
                            *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header
                              + 0x108),(size_type)__n);
    *ppLVar6 = in_stack_ffffffffffffff88;
    comp = (Compressor *)((long)&__n->_vptr_Compressor + 1);
  }
  std::
  vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
  ::operator[]((vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
                *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x108),0)
  ;
  FVar2 = defaultFormat(in_stack_ffffffffffffff80);
  *(Format *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0xe0) = FVar2;
  iVar3 = numLinesInBuffer(in_stack_ffffffffffffff80);
  *(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x120) = iVar3;
  *(long *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x128) =
       (long)hdr *
       (long)*(int *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x120)
  ;
  for (local_48 = 0;
      sVar7 = std::
              vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
              ::size((vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
                      *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header +
                        0x108)), local_48 < sVar7; local_48 = local_48 + 1) {
    std::
    vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
    ::operator[]((vector<Imf_3_3::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_3::(anonymous_namespace)::LineBuffer_*>_>
                  *)(*(long *)&(in_RDI->_map)._M_t._M_impl.super__Rb_tree_header._M_header + 0x108),
                 local_48);
    Array<char>::resizeErase(in_stack_ffffffffffffff90,(long)in_stack_ffffffffffffff88);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(iVar8,in_stack_ffffffffffffffa0),(size_type)comp);
  offsetInLineBufferTable
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff90,
             (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void
OutputFile::initialize (const Header& header)
{
    _data->header = header;

    // "fix" the type if it happens to be set incorrectly
    // (attribute is optional, but ensure it is correct if it exists)
    if (_data->header.hasType ()) { _data->header.setType (SCANLINEIMAGE); }

    const Box2i& dataWindow = header.dataWindow ();

    _data->currentScanLine = (header.lineOrder () == INCREASING_Y)
                                 ? dataWindow.min.y
                                 : dataWindow.max.y;

    _data->missingScanLines = dataWindow.max.y - dataWindow.min.y + 1;
    _data->lineOrder        = header.lineOrder ();
    _data->minX             = dataWindow.min.x;
    _data->maxX             = dataWindow.max.x;
    _data->minY             = dataWindow.min.y;
    _data->maxY             = dataWindow.max.y;

    size_t maxBytesPerLine =
        bytesPerLineTable (_data->header, _data->bytesPerLine);

    for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
    {
        _data->lineBuffers[i] = new LineBuffer (newCompressor (
            _data->header.compression (), maxBytesPerLine, _data->header));
    }

    LineBuffer* lineBuffer = _data->lineBuffers[0];
    _data->format          = defaultFormat (lineBuffer->compressor);
    _data->linesInBuffer   = numLinesInBuffer (lineBuffer->compressor);
    _data->lineBufferSize  = maxBytesPerLine * _data->linesInBuffer;

    for (size_t i = 0; i < _data->lineBuffers.size (); i++)
        _data->lineBuffers[i]->buffer.resizeErase (_data->lineBufferSize);

    int lineOffsetSize =
        (dataWindow.max.y - dataWindow.min.y + _data->linesInBuffer) /
        _data->linesInBuffer;

    _data->lineOffsets.resize (lineOffsetSize);

    offsetInLineBufferTable (
        _data->bytesPerLine, _data->linesInBuffer, _data->offsetInLineBuffer);
}